

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CS248::Matrix4x4::rotation(double theta,Axis axis)

{
  double *pdVar1;
  Matrix4x4 *this;
  int in_ESI;
  Matrix4x4 *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  Matrix4x4 *B;
  undefined8 in_stack_ffffffffffffff78;
  Matrix4x4 *in_stack_ffffffffffffff80;
  Matrix4x4 *in_stack_ffffffffffffff90;
  
  Matrix4x4(in_stack_ffffffffffffff90);
  if (in_ESI == 0) {
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 1.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    dVar2 = cos(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = dVar2;
    dVar2 = sin(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = -dVar2;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    dVar2 = sin(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = dVar2;
    dVar2 = cos(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = dVar2;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 1.0;
  }
  else if (in_ESI == 1) {
    dVar2 = cos(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = dVar2;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    dVar2 = sin(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = dVar2;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 1.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    dVar2 = sin(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = -dVar2;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    dVar2 = cos(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = dVar2;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 0.0;
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        (int)in_stack_ffffffffffffff78);
    *pdVar1 = 1.0;
  }
  else if (in_ESI == 2) {
    dVar2 = cos(in_XMM0_Qa);
    pdVar1 = operator()(in_stack_ffffffffffffff80,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = dVar2;
    dVar3 = sin(in_XMM0_Qa);
    this = (Matrix4x4 *)((ulong)dVar3 ^ 0x8000000000000000);
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = (double)this;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    dVar3 = sin(in_XMM0_Qa);
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = dVar3;
    dVar3 = cos(in_XMM0_Qa);
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = dVar3;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 1.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 0.0;
    pdVar1 = operator()(this,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
    *pdVar1 = 1.0;
  }
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::rotation(double theta, Axis axis) {
    Matrix4x4 B;

    switch (axis)
    {
    case Axis::X:
      B(0, 0) = 1.; B(0, 1) = 0.;         B(0, 2) = 0.;           B(0, 3) = 0.;
      B(1, 0) = 0.; B(1, 1) = cos(theta); B(1, 2) = -sin(theta);  B(1, 3) = 0.;
      B(2, 0) = 0.; B(2, 1) = sin(theta); B(2, 2) = cos(theta);   B(2, 3) = 0.;
      B(3, 0) = 0.; B(3, 1) = 0.;          B(3, 2) = 0.;          B(3, 3) = 1.;
      break;
    case Axis::Y:
      B(0, 0) = cos(theta);   B(0, 1) = 0.; B(0, 2) = sin(theta); B(0, 3) = 0.;
      B(1, 0) = 0.;           B(1, 1) = 1.; B(1, 2) = 0.;         B(1, 3) = 0.;
      B(2, 0) = -sin(theta);  B(2, 1) = 0.; B(2, 2) = cos(theta); B(2, 3) = 0.;
      B(3, 0) = 0.;           B(3, 1) = 0.; B(3, 2) = 0.;         B(3, 3) = 1.;
      break;
    case Axis::Z:
      B(0, 0) = cos(theta); B(0, 1) = -sin(theta);  B(0, 2) = 0.; B(0, 3) = 0.;
      B(1, 0) = sin(theta); B(1, 1) = cos(theta);   B(1, 2) = 0.; B(1, 3) = 0.;
      B(2, 0) = 0.;         B(2, 1) = 0.;           B(2, 2) = 1.; B(2, 3) = 0.;
      B(3, 0) = 0.;         B(3, 1) = 0.;           B(3, 2) = 0.; B(3, 3) = 1.;
      break;
    default:
      break;
    }

    return B;
  }